

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Reader::readNumber(Reader *this)

{
  char local_19;
  char *pcStack_18;
  char c;
  char *p;
  Reader *this_local;
  
  local_19 = '0';
  pcStack_18 = this->current_;
  while ('/' < local_19 && local_19 < ':') {
    this->current_ = pcStack_18;
    if (pcStack_18 < this->end_) {
      local_19 = *pcStack_18;
      pcStack_18 = pcStack_18 + 1;
    }
    else {
      local_19 = '\0';
    }
  }
  if (local_19 == '.') {
    this->current_ = pcStack_18;
    if (pcStack_18 < this->end_) {
      local_19 = *pcStack_18;
      pcStack_18 = pcStack_18 + 1;
    }
    else {
      local_19 = '\0';
    }
    while ('/' < local_19 && local_19 < ':') {
      this->current_ = pcStack_18;
      if (pcStack_18 < this->end_) {
        local_19 = *pcStack_18;
        pcStack_18 = pcStack_18 + 1;
      }
      else {
        local_19 = '\0';
      }
    }
  }
  if ((local_19 == 'e') || (local_19 == 'E')) {
    this->current_ = pcStack_18;
    if (pcStack_18 < this->end_) {
      local_19 = *pcStack_18;
      pcStack_18 = pcStack_18 + 1;
    }
    else {
      local_19 = '\0';
    }
    if ((local_19 == '+') || (local_19 == '-')) {
      this->current_ = pcStack_18;
      if (pcStack_18 < this->end_) {
        local_19 = *pcStack_18;
        pcStack_18 = pcStack_18 + 1;
      }
      else {
        local_19 = '\0';
      }
    }
    while ('/' < local_19 && local_19 < ':') {
      this->current_ = pcStack_18;
      if (pcStack_18 < this->end_) {
        local_19 = *pcStack_18;
        pcStack_18 = pcStack_18 + 1;
      }
      else {
        local_19 = '\0';
      }
    }
  }
  return;
}

Assistant:

void Reader::readNumber() {
  const char *p = current_;
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : 0;
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : 0;
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : 0;
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : 0;
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : 0;
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : 0;
  }
}